

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_apop(connectdata *conn)

{
  uchar *puVar1;
  undefined8 context;
  uint uVar2;
  MD5_context *context_00;
  size_t sVar3;
  char local_78 [8];
  char secret [33];
  byte local_48 [8];
  uchar digest [16];
  MD5_context *ctxt;
  size_t i;
  pop3_conn *pop3c;
  CURLcode result;
  connectdata *conn_local;
  
  if (((conn->bits).user_passwd & 1U) == 0) {
    state(conn,POP3_STOP);
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    context_00 = Curl_MD5_init(Curl_DIGEST_MD5);
    if (context_00 == (MD5_context *)0x0) {
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      puVar1 = (uchar *)(conn->proto).imapc.mailbox_uidvalidity;
      digest._8_8_ = context_00;
      sVar3 = strlen((conn->proto).imapc.mailbox_uidvalidity);
      uVar2 = curlx_uztoui(sVar3);
      Curl_MD5_update(context_00,puVar1,uVar2);
      context = digest._8_8_;
      puVar1 = (uchar *)conn->passwd;
      sVar3 = strlen(conn->passwd);
      uVar2 = curlx_uztoui(sVar3);
      Curl_MD5_update((MD5_context *)context,puVar1,uVar2);
      Curl_MD5_final((MD5_context *)digest._8_8_,local_48);
      for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
          ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
        curl_msnprintf(local_78 + (long)ctxt * 2,3,"%02x",(ulong)local_48[(long)ctxt]);
      }
      conn_local._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"APOP %s %s",conn->user,local_78);
      if (conn_local._4_4_ == CURLE_OK) {
        state(conn,POP3_APOP);
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_perform_apop(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  size_t i;
  MD5_context *ctxt;
  unsigned char digest[MD5_DIGEST_LEN];
  char secret[2 * MD5_DIGEST_LEN + 1];

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, POP3_STOP);

    return result;
  }

  /* Create the digest */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) pop3c->apoptimestamp,
                  curlx_uztoui(strlen(pop3c->apoptimestamp)));

  Curl_MD5_update(ctxt, (const unsigned char *) conn->passwd,
                  curlx_uztoui(strlen(conn->passwd)));

  /* Finalise the digest */
  Curl_MD5_final(ctxt, digest);

  /* Convert the calculated 16 octet digest into a 32 byte hex string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&secret[2 * i], 3, "%02x", digest[i]);

  result = Curl_pp_sendf(&pop3c->pp, "APOP %s %s", conn->user, secret);

  if(!result)
    state(conn, POP3_APOP);

  return result;
}